

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void __thiscall benchmark::anon_unknown_1::TimerManager::InternalStop(TimerManager *this)

{
  bool bVar1;
  WallTime WVar2;
  double dVar3;
  double dVar4;
  CheckHandler local_18;
  
  bVar1 = this->running_;
  if (bVar1 == true) {
    internal::GetNullLogInstance();
  }
  else {
    internal::CheckHandler::CheckHandler
              (&local_18,"running_",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"InternalStop",0x118);
  }
  if (bVar1 != false) {
    this->running_ = false;
    WVar2 = walltime::Now();
    this->real_time_used_ = (WVar2 - this->start_real_time_) + this->real_time_used_;
    dVar3 = MyCPUUsage();
    dVar4 = ChildrenCPUUsage();
    this->cpu_time_used_ = ((dVar4 + dVar3) - this->start_cpu_time_) + this->cpu_time_used_;
    return;
  }
  internal::CheckHandler::~CheckHandler(&local_18);
}

Assistant:

REQUIRES(lock_) {
    CHECK(running_);
    running_ = false;
    real_time_used_ += walltime::Now() - start_real_time_;
    cpu_time_used_ += ((MyCPUUsage() + ChildrenCPUUsage())
                       - start_cpu_time_);
  }